

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

FmsInt CompareIntData(FmsIntType itype,FmsInt size,void *lhs,void *rhs)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  FmsInt FVar5;
  FmsInt FVar6;
  
  if (lhs == rhs) {
    return 0;
  }
  if (rhs != (void *)0x0 && lhs != (void *)0x0) {
    switch(itype) {
    case FMS_INT8:
      FVar6 = 0;
      do {
        if (size == FVar6) {
          return 0;
        }
        pcVar3 = (char *)((long)lhs + FVar6);
        FVar5 = FVar6 + 1;
        pcVar4 = (char *)((long)rhs + FVar6);
        FVar6 = FVar5;
      } while (*pcVar3 == *pcVar4);
      break;
    case FMS_INT16:
      FVar6 = 0;
      do {
        if (size == FVar6) {
          return 0;
        }
        lVar1 = FVar6 * 2;
        FVar5 = FVar6 + 1;
        lVar2 = FVar6 * 2;
        FVar6 = FVar5;
      } while (*(short *)((long)lhs + lVar1) == *(short *)((long)rhs + lVar2));
      break;
    case FMS_INT32:
      FVar6 = 0;
      do {
        if (size == FVar6) {
          return 0;
        }
        lVar1 = FVar6 * 4;
        FVar5 = FVar6 + 1;
        lVar2 = FVar6 * 4;
        FVar6 = FVar5;
      } while (*(int *)((long)lhs + lVar1) == *(int *)((long)rhs + lVar2));
      break;
    case FMS_INT64:
      FVar6 = 0;
      do {
        if (size == FVar6) {
          return 0;
        }
        lVar1 = FVar6 * 8;
        FVar5 = FVar6 + 1;
        lVar2 = FVar6 * 8;
        FVar6 = FVar5;
      } while (*(long *)((long)lhs + lVar1) == *(long *)((long)rhs + lVar2));
      break;
    case FMS_ORIENTATION_INT_TYPE:
      FVar6 = 0;
      do {
        if (size == FVar6) {
          return 0;
        }
        pcVar3 = (char *)((long)lhs + FVar6);
        FVar5 = FVar6 + 1;
        pcVar4 = (char *)((long)rhs + FVar6);
        FVar6 = FVar5;
      } while (*pcVar3 == *pcVar4);
      break;
    case FMS_UINT16:
      FVar6 = 0;
      do {
        if (size == FVar6) {
          return 0;
        }
        lVar1 = FVar6 * 2;
        FVar5 = FVar6 + 1;
        lVar2 = FVar6 * 2;
        FVar6 = FVar5;
      } while (*(short *)((long)lhs + lVar1) == *(short *)((long)rhs + lVar2));
      break;
    case FMS_UINT32:
      FVar6 = 0;
      do {
        if (size == FVar6) {
          return 0;
        }
        lVar1 = FVar6 * 4;
        FVar5 = FVar6 + 1;
        lVar2 = FVar6 * 4;
        FVar6 = FVar5;
      } while (*(int *)((long)lhs + lVar1) == *(int *)((long)rhs + lVar2));
      break;
    case FMS_INT_TYPE:
      FVar6 = 0;
      do {
        if (size == FVar6) {
          return 0;
        }
        lVar1 = FVar6 * 8;
        FVar5 = FVar6 + 1;
        lVar2 = FVar6 * 8;
        FVar6 = FVar5;
      } while (*(long *)((long)lhs + lVar1) == *(long *)((long)rhs + lVar2));
      break;
    default:
      return 2;
    }
    return FVar5;
  }
  return 1;
}

Assistant:

static inline FmsInt CompareIntData(FmsIntType itype, FmsInt size,
                                    const void *lhs, const void *rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return 1;
  if(!rhs) return 1;
  FmsInt isDifferent = 0;
  switch(itype) {
  case FMS_INT8:
    COMPARE_INT_DATA(int8_t, lhs, rhs, size, isDifferent);
    break;
  case FMS_INT16:
    COMPARE_INT_DATA(int16_t, lhs, rhs, size, isDifferent);
    break;
  case FMS_INT32:
    COMPARE_INT_DATA(int32_t, lhs, rhs, size, isDifferent);
    break;
  case FMS_INT64:
    COMPARE_INT_DATA(int64_t, lhs, rhs, size, isDifferent);
    break;
  case FMS_UINT8:
    COMPARE_INT_DATA(uint8_t, lhs, rhs, size, isDifferent);
    break;
  case FMS_UINT16:
    COMPARE_INT_DATA(uint16_t, lhs, rhs, size, isDifferent);
    break;
  case FMS_UINT32:
    COMPARE_INT_DATA(uint32_t, lhs, rhs, size, isDifferent);
    break;
  case FMS_UINT64:
    COMPARE_INT_DATA(uint64_t, lhs, rhs, size, isDifferent);
    break;
  default:
    return 2;
  }
  return isDifferent;
}